

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall despot::Parser::PrintAction(Parser *this,ACT_TYPE action,ostream *out)

{
  ostream *poVar1;
  reference this_00;
  string *psVar2;
  ostream *out_local;
  ACT_TYPE action_local;
  Parser *this_local;
  
  poVar1 = (ostream *)std::ostream::operator<<(out,action);
  poVar1 = std::operator<<(poVar1,":");
  this_00 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                      (&this->action_vars_,0);
  psVar2 = Variable::GetValue_abi_cxx11_(&this_00->super_Variable,action);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Parser::PrintAction(ACT_TYPE action, ostream& out) const {
	out << action << ":" << action_vars_[0].GetValue(action) << endl;
}